

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::MergeReturnPass::ProcessStructured
          (MergeReturnPass *this,Function *function,
          vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *return_blocks)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  MessageConsumer *pMVar4;
  char *__args_3;
  CFG *pCVar5;
  reference root;
  Instruction *this_00;
  reference ppBVar6;
  StructuredControlState *pSVar7;
  IRContext *this_01;
  __normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
  local_158;
  BasicBlock **local_150;
  __normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
  local_148;
  __normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
  local_140;
  uint32_t local_134;
  BasicBlock *pBStack_130;
  uint32_t blockId_1;
  BasicBlock *block_1;
  iterator __end2_1;
  iterator __begin2_1;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *__range2_1;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  predicated;
  void *local_d0;
  uint32_t local_c4;
  BasicBlock *pBStack_c0;
  uint32_t blockId;
  BasicBlock *block;
  iterator __end2;
  iterator __begin2;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *__range2;
  void *local_98;
  iterator local_90;
  undefined1 local_80 [8];
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> order;
  allocator<char> local_49;
  string local_48 [8];
  string message;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *return_blocks_local;
  Function *function_local;
  MergeReturnPass *this_local;
  
  message.field_2._8_8_ = return_blocks;
  bVar1 = HasNontrivialUnreachableBlocks(this,function);
  if (bVar1) {
    pMVar4 = Pass::consumer((Pass *)this);
    bVar1 = std::function::operator_cast_to_bool((function *)pMVar4);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_48,
                 "Module contains unreachable blocks during merge return.  Run dead branch elimination before merge return."
                 ,&local_49);
      std::allocator<char>::~allocator(&local_49);
      pMVar4 = Pass::consumer((Pass *)this);
      memset(&order.
              super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
              ._M_impl._M_node._M_size,0,0x18);
      __args_3 = (char *)std::__cxx11::string::c_str();
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(pMVar4,SPV_MSG_ERROR,(char *)0x0,
                   (spv_position_t *)
                   &order.
                    super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    ._M_impl._M_node._M_size,__args_3);
      std::__cxx11::string::~string(local_48);
    }
    this_local._7_1_ = false;
  }
  else {
    RecordImmediateDominators(this,function);
    bVar1 = AddSingleCaseSwitchAroundFunction(this);
    if (bVar1) {
      std::__cxx11::list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
      ::list((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
             local_80);
      pCVar5 = Pass::cfg((Pass *)this);
      local_90 = Function::begin(function);
      root = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*(&local_90);
      CFG::ComputeStructuredOrder
                (pCVar5,function,root,
                 (list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
                 local_80);
      std::
      vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
      ::clear(&this->state_);
      local_98 = (void *)0x0;
      __range2 = (list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
                 0x0;
      std::
      vector<spvtools::opt::MergeReturnPass::StructuredControlState,std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>>
      ::emplace_back<decltype(nullptr),decltype(nullptr)>
                ((vector<spvtools::opt::MergeReturnPass::StructuredControlState,std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>>
                  *)&this->state_,&local_98,&__range2);
      __end2 = std::__cxx11::
               list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
               begin((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                      *)local_80);
      block = (BasicBlock *)
              std::__cxx11::
              list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::end
                        ((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                          *)local_80);
      while (bVar1 = std::operator!=(&__end2,(_Self *)&block), bVar1) {
        ppBVar6 = std::_List_iterator<spvtools::opt::BasicBlock_*>::operator*(&__end2);
        pBStack_c0 = *ppBVar6;
        pCVar5 = Pass::cfg((Pass *)this);
        bVar1 = CFG::IsPseudoEntryBlock(pCVar5,pBStack_c0);
        if (!bVar1) {
          pCVar5 = Pass::cfg((Pass *)this);
          bVar1 = CFG::IsPseudoExitBlock(pCVar5,pBStack_c0);
          if ((!bVar1) && (pBStack_c0 != this->final_return_block_)) {
            this_00 = BasicBlock::GetLabelInst(pBStack_c0);
            uVar2 = Instruction::result_id(this_00);
            local_c4 = uVar2;
            pSVar7 = CurrentState(this);
            uVar3 = StructuredControlState::CurrentMergeId(pSVar7);
            if (uVar2 == uVar3) {
              std::
              vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
              ::pop_back(&this->state_);
            }
            ProcessStructuredBlock(this,pBStack_c0);
            GenerateState(this,pBStack_c0);
          }
        }
        std::_List_iterator<spvtools::opt::BasicBlock_*>::operator++(&__end2);
      }
      std::
      vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
      ::clear(&this->state_);
      local_d0 = (void *)0x0;
      predicated._M_h._M_single_bucket = (__node_base_ptr)0x0;
      std::
      vector<spvtools::opt::MergeReturnPass::StructuredControlState,std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>>
      ::emplace_back<decltype(nullptr),decltype(nullptr)>
                ((vector<spvtools::opt::MergeReturnPass::StructuredControlState,std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>>
                  *)&this->state_,&local_d0,&predicated._M_h._M_single_bucket);
      std::
      unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
      ::unordered_set((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                       *)&__range2_1);
      __end2_1 = std::__cxx11::
                 list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
                 begin((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                        *)local_80);
      block_1 = (BasicBlock *)
                std::__cxx11::
                list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::end
                          ((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                            *)local_80);
      while (bVar1 = std::operator!=(&__end2_1,(_Self *)&block_1), bVar1) {
        ppBVar6 = std::_List_iterator<spvtools::opt::BasicBlock_*>::operator*(&__end2_1);
        pBStack_130 = *ppBVar6;
        pCVar5 = Pass::cfg((Pass *)this);
        bVar1 = CFG::IsPseudoEntryBlock(pCVar5,pBStack_130);
        if (!bVar1) {
          pCVar5 = Pass::cfg((Pass *)this);
          bVar1 = CFG::IsPseudoExitBlock(pCVar5,pBStack_130);
          if (!bVar1) {
            uVar2 = BasicBlock::id(pBStack_130);
            local_134 = uVar2;
            pSVar7 = CurrentState(this);
            uVar3 = StructuredControlState::CurrentMergeId(pSVar7);
            if (uVar2 == uVar3) {
              std::
              vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
              ::pop_back(&this->state_);
            }
            local_148._M_current =
                 (BasicBlock **)
                 std::
                 vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
                 begin((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                        *)message.field_2._8_8_);
            local_150 = (BasicBlock **)
                        std::
                        vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                        ::end((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                               *)message.field_2._8_8_);
            local_140 = std::
                        find<__gnu_cxx::__normal_iterator<spvtools::opt::BasicBlock*const*,std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>>,spvtools::opt::BasicBlock*>
                                  (local_148,
                                   (__normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
                                    )local_150,&stack0xfffffffffffffed0);
            local_158._M_current =
                 (BasicBlock **)
                 std::
                 vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
                 end((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                      *)message.field_2._8_8_);
            bVar1 = __gnu_cxx::operator!=(&local_140,&local_158);
            if ((bVar1) &&
               (bVar1 = PredicateBlocks(this,pBStack_130,
                                        (unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                                         *)&__range2_1,
                                        (list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                                         *)local_80), !bVar1)) {
              this_local._7_1_ = false;
              goto LAB_004268af;
            }
            GenerateState(this,pBStack_130);
          }
        }
        std::_List_iterator<spvtools::opt::BasicBlock_*>::operator++(&__end2_1);
      }
      this_01 = Pass::context((Pass *)this);
      IRContext::RemoveDominatorAnalysis(this_01,function);
      AddNewPhiNodes(this);
      this_local._7_1_ = true;
LAB_004268af:
      std::
      unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
      ::~unordered_set((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                        *)&__range2_1);
      std::__cxx11::list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
      ::~list((list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
              local_80);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool MergeReturnPass::ProcessStructured(
    Function* function, const std::vector<BasicBlock*>& return_blocks) {
  if (HasNontrivialUnreachableBlocks(function)) {
    if (consumer()) {
      std::string message =
          "Module contains unreachable blocks during merge return.  Run dead "
          "branch elimination before merge return.";
      consumer()(SPV_MSG_ERROR, 0, {0, 0, 0}, message.c_str());
    }
    return false;
  }

  RecordImmediateDominators(function);
  if (!AddSingleCaseSwitchAroundFunction()) {
    return false;
  }

  std::list<BasicBlock*> order;
  cfg()->ComputeStructuredOrder(function, &*function->begin(), &order);

  state_.clear();
  state_.emplace_back(nullptr, nullptr);
  for (auto block : order) {
    if (cfg()->IsPseudoEntryBlock(block) || cfg()->IsPseudoExitBlock(block) ||
        block == final_return_block_) {
      continue;
    }

    auto blockId = block->GetLabelInst()->result_id();
    if (blockId == CurrentState().CurrentMergeId()) {
      // Pop the current state as we've hit the merge
      state_.pop_back();
    }

    ProcessStructuredBlock(block);

    // Generate state for next block if warranted
    GenerateState(block);
  }

  state_.clear();
  state_.emplace_back(nullptr, nullptr);
  std::unordered_set<BasicBlock*> predicated;
  for (auto block : order) {
    if (cfg()->IsPseudoEntryBlock(block) || cfg()->IsPseudoExitBlock(block)) {
      continue;
    }

    auto blockId = block->id();
    if (blockId == CurrentState().CurrentMergeId()) {
      // Pop the current state as we've hit the merge
      state_.pop_back();
    }

    // Predicate successors of the original return blocks as necessary.
    if (std::find(return_blocks.begin(), return_blocks.end(), block) !=
        return_blocks.end()) {
      if (!PredicateBlocks(block, &predicated, &order)) {
        return false;
      }
    }

    // Generate state for next block if warranted
    GenerateState(block);
  }

  // We have not kept the dominator tree up-to-date.
  // Invalidate it at this point to make sure it will be rebuilt.
  context()->RemoveDominatorAnalysis(function);
  AddNewPhiNodes();
  return true;
}